

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O0

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>::
pick_card_messaging_group
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true> *this,Card *card)

{
  bool bVar1;
  vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_> *local_58;
  __normal_iterator<Apple::II::Card_**,_std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>_>
  local_48;
  Card **local_40;
  __normal_iterator<Apple::II::Card_**,_std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>_>
  local_38;
  __normal_iterator<Apple::II::Card_**,_std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>_>
  local_30;
  vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_> *local_28;
  vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_> *intended;
  Card *pCStack_18;
  bool is_every_cycle;
  Card *card_local;
  ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true> *this_local;
  
  pCStack_18 = card;
  card_local = (Card *)this;
  intended._7_1_ = is_every_cycle_card(this,card);
  if ((bool)intended._7_1_) {
    local_58 = &this->every_cycle_cards_;
  }
  else {
    local_58 = &this->just_in_time_cards_;
  }
  local_28 = local_58;
  local_38._M_current =
       (Card **)std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>::begin(local_58);
  local_40 = (Card **)std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>::end
                                (local_28);
  local_30 = std::
             find<__gnu_cxx::__normal_iterator<Apple::II::Card**,std::vector<Apple::II::Card*,std::allocator<Apple::II::Card*>>>,Apple::II::Card*>
                       (local_38,(__normal_iterator<Apple::II::Card_**,_std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>_>
                                  )local_40,&stack0xffffffffffffffe8);
  local_48._M_current =
       (Card **)std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>::end(local_28);
  bVar1 = __gnu_cxx::operator!=(&local_30,&local_48);
  if (!bVar1) {
    this->card_lists_are_dirty_ = true;
    this->card_became_just_in_time_ =
         (this->card_became_just_in_time_ & 1U) != 0 || ((intended._7_1_ ^ 0xff) & 1) != 0;
  }
  return;
}

Assistant:

void pick_card_messaging_group(Apple::II::Card *card) {
			// Simplify to a card being either just-in-time or realtime.
			// Don't worry about exactly what it's watching,
			const bool is_every_cycle = is_every_cycle_card(card);
			std::vector<Apple::II::Card *> &intended = is_every_cycle ? every_cycle_cards_ : just_in_time_cards_;

			// If the card is already in the proper group, stop.
			if(std::find(intended.begin(), intended.end(), card) != intended.end()) return;

			// Otherwise, mark the sets as dirty. It isn't safe to transition the card here,
			// as the main loop may be part way through iterating the two lists.
			card_lists_are_dirty_ = true;
			card_became_just_in_time_ |= !is_every_cycle;
		}